

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decode.c
# Opt level: O0

int m_se(aec_stream_conflict *strm)

{
  internal_state_conflict *piVar1;
  uint32_t uVar2;
  uint32_t s;
  int32_t d1;
  uint32_t m;
  uint32_t i;
  internal_state_conflict *state;
  aec_stream_conflict *strm_local;
  
  piVar1 = strm->state;
  if ((strm->avail_in < (ulong)strm->state->in_blklen) ||
     (strm->avail_out < (ulong)strm->state->out_blklen)) {
    piVar1->mode = m_se_decode;
    piVar1->sample_counter = piVar1->ref;
  }
  else {
    for (d1 = piVar1->ref; (uint)d1 < strm->block_size; d1 = d1 + 1) {
      uVar2 = direct_get_fs(strm);
      if (0x5a < uVar2) {
        return -1;
      }
      s = uVar2 - piVar1->se_table[uVar2 * 2 + 1];
      if ((d1 & 1U) == 0) {
        put_sample(strm,piVar1->se_table[uVar2 << 1] - s);
        d1 = d1 + 1;
      }
      put_sample(strm,s);
    }
    piVar1->mode = m_next_cds;
  }
  return 1;
}

Assistant:

static int m_se(struct aec_stream *strm)
{
    struct internal_state *state = strm->state;

    if (BUFFERSPACE(strm)) {
        uint32_t i = state->ref;

        while (i < strm->block_size) {
            uint32_t m = direct_get_fs(strm);
            int32_t d1;

            if (m > SE_TABLE_SIZE)
                return M_ERROR;

            d1 = m - state->se_table[2 * m + 1];

            if ((i & 1) == 0) {
                put_sample(strm, state->se_table[2 * m] - d1);
                i++;
            }
            put_sample(strm, d1);
            i++;
        }
        state->mode = m_next_cds;
    } else {
        state->mode = m_se_decode;
        state->sample_counter = state->ref;
    }
    return M_CONTINUE;
}